

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O0

Color * __thiscall Bezier::getColor(Bezier *this,double t,double theta)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uchar *in_RCX;
  size_t *in_RDX;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  uchar *in_RSI;
  Color *in_RDI;
  Color *ctx;
  size_t in_R8;
  double y;
  double x;
  double in_stack_00000068;
  double in_stack_00000070;
  Picture *in_stack_00000078;
  
  if (*(long *)(in_RSI + 0x70) == 0) {
    in_RDI->x = *(double *)(in_RSI + 8);
    in_RDI->y = *(double *)(in_RSI + 0x10);
    in_RDI->z = *(double *)(in_RSI + 0x18);
  }
  else {
    ctx = in_RDI;
    uVar2 = sign((EVP_PKEY_CTX *)in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
    bVar1 = false;
    if (-1 < (int)uVar2) {
      uVar2 = sign((EVP_PKEY_CTX *)ctx,in_RSI,siglen,(uchar *)(ulong)uVar2,in_R8);
      bVar1 = false;
      if (-1 < (int)uVar2) {
        uVar2 = sign((EVP_PKEY_CTX *)ctx,in_RSI,siglen_00,(uchar *)(ulong)uVar2,in_R8);
        bVar1 = false;
        if ((int)uVar2 < 1) {
          iVar3 = sign((EVP_PKEY_CTX *)ctx,in_RSI,siglen_01,(uchar *)(ulong)uVar2,in_R8);
          bVar1 = iVar3 < 1;
        }
      }
    }
    if (!bVar1) {
      __assert_fail("sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lazycal[P]Progressive-Photon-Mapping/Bezier.cpp"
                    ,0xc1,"Color Bezier::getColor(double, double)");
    }
    Picture::getColor(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return in_RDI;
}

Assistant:

Color Bezier::getColor(double t, double theta)
{
    if (texture.data == NULL) return color;
    double x = t, y = theta / PI / 2 + 0.5;
#ifdef DEBUG
    assert(sign(x) >= 0 && sign(y) >=0 && sign(x - 1) <= 0 && sign(y - 1) <= 0);
#endif
    return texture.getColor(x, y);
}